

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O2

arth * gen_load(compiler_state_t *cstate,int proto,arth *inst,int size)

{
  int code;
  int iVar1;
  uint uVar2;
  slist *psVar3;
  slist *psVar4;
  block *pbVar5;
  block *b1;
  slist *s0;
  slist *s0_00;
  char *fmt;
  
  iVar1 = alloc_reg(cstate);
  cstate->regused[inst->regno] = 0;
  if (size == 1) {
    code = 0x50;
  }
  else if (size == 2) {
    code = 0x48;
  }
  else {
    if (size != 4) {
      fmt = "data size must be 1, 2, or 4";
      goto LAB_0010e28e;
    }
    code = 0x40;
  }
  switch(proto) {
  case 1:
    psVar3 = gen_abs_offset_varpart(cstate,&cstate->off_linkhdr);
    if (psVar3 == (slist *)0x0) {
      psVar3 = xfer_to_x(cstate,inst);
    }
    else {
      psVar4 = xfer_to_a(cstate,inst);
      sappend(psVar4,psVar4);
      psVar4 = new_stmt(cstate,0xc);
      sappend(psVar4,psVar4);
      psVar4 = new_stmt(cstate,7);
      sappend(psVar4,psVar4);
    }
    psVar4 = new_stmt(cstate,code);
    (psVar4->s).k = (cstate->off_linkhdr).constant_part;
    break;
  case 2:
  case 3:
  case 4:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
    psVar3 = gen_abs_offset_varpart(cstate,&cstate->off_linkpl);
    if (psVar3 == (slist *)0x0) {
      psVar3 = xfer_to_x(cstate,inst);
    }
    else {
      psVar4 = xfer_to_a(cstate,inst);
      sappend(psVar4,psVar4);
      psVar4 = new_stmt(cstate,0xc);
      sappend(psVar4,psVar4);
      psVar4 = new_stmt(cstate,7);
      sappend(psVar4,psVar4);
    }
    psVar4 = new_stmt(cstate,code);
    (psVar4->s).k = cstate->off_nl + (cstate->off_linkpl).constant_part;
    sappend(psVar4,psVar4);
    sappend(s0,psVar3);
    b1 = gen_proto_abbrev(cstate,proto);
    pbVar5 = inst->b;
    if (pbVar5 != (block *)0x0) goto LAB_0010e172;
    goto LAB_0010e17a;
  case 5:
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0x15:
  case 0x16:
  case 0x29:
    psVar3 = gen_loadx_iphdrlen(cstate);
    psVar4 = xfer_to_a(cstate,inst);
    sappend(psVar4,psVar4);
    psVar4 = new_stmt(cstate,0xc);
    sappend(psVar4,psVar4);
    psVar4 = new_stmt(cstate,7);
    sappend(psVar4,psVar4);
    psVar4 = new_stmt(cstate,code);
    sappend(psVar4,psVar4);
    uVar2 = cstate->off_nl + (cstate->off_linkpl).constant_part;
    (psVar4->s).k = uVar2;
    sappend((slist *)(ulong)uVar2,psVar3);
    pbVar5 = gen_proto_abbrev(cstate,proto);
    b1 = gen_ipfrag(cstate);
    gen_and(pbVar5,b1);
    if (inst->b != (block *)0x0) {
      gen_and(inst->b,b1);
    }
    pbVar5 = gen_linktype(cstate,0x800);
LAB_0010e172:
    gen_and(pbVar5,b1);
LAB_0010e17a:
    inst->b = b1;
    goto LAB_0010e17d;
  case 0x12:
    fmt = "IPv6 upper-layer protocol is not supported by proto[x]";
    goto LAB_0010e28e;
  default:
    fmt = "unsupported index operation";
LAB_0010e28e:
    bpf_error(cstate,fmt);
  case 0x28:
    uVar2 = cstate->linktype - 0x77;
    if ((0x2c < uVar2) || ((0x100000000101U >> ((ulong)uVar2 & 0x3f) & 1) == 0)) {
      fmt = "radio information not present in capture";
      goto LAB_0010e28e;
    }
    psVar3 = xfer_to_x(cstate,inst);
    psVar4 = new_stmt(cstate,code);
  }
  sappend(psVar4,psVar4);
  sappend(s0_00,psVar3);
LAB_0010e17d:
  inst->regno = iVar1;
  psVar3 = new_stmt(cstate,2);
  (psVar3->s).k = iVar1;
  sappend(psVar3,psVar3);
  return inst;
}

Assistant:

struct arth *
gen_load(compiler_state_t *cstate, int proto, struct arth *inst, int size)
{
	struct slist *s, *tmp;
	struct block *b;
	int regno = alloc_reg(cstate);

	free_reg(cstate, inst->regno);
	switch (size) {

	default:
		bpf_error(cstate, "data size must be 1, 2, or 4");

	case 1:
		size = BPF_B;
		break;

	case 2:
		size = BPF_H;
		break;

	case 4:
		size = BPF_W;
		break;
	}
	switch (proto) {
	default:
		bpf_error(cstate, "unsupported index operation");

	case Q_RADIO:
		/*
		 * The offset is relative to the beginning of the packet
		 * data, if we have a radio header.  (If we don't, this
		 * is an error.)
		 */
		if (cstate->linktype != DLT_IEEE802_11_RADIO_AVS &&
		    cstate->linktype != DLT_IEEE802_11_RADIO &&
		    cstate->linktype != DLT_PRISM_HEADER)
			bpf_error(cstate, "radio information not present in capture");

		/*
		 * Load into the X register the offset computed into the
		 * register specified by "index".
		 */
		s = xfer_to_x(cstate, inst);

		/*
		 * Load the item at that offset.
		 */
		tmp = new_stmt(cstate, BPF_LD|BPF_IND|size);
		sappend(s, tmp);
		sappend(inst->s, s);
		break;

	case Q_LINK:
		/*
		 * The offset is relative to the beginning of
		 * the link-layer header.
		 *
		 * XXX - what about ATM LANE?  Should the index be
		 * relative to the beginning of the AAL5 frame, so
		 * that 0 refers to the beginning of the LE Control
		 * field, or relative to the beginning of the LAN
		 * frame, so that 0 refers, for Ethernet LANE, to
		 * the beginning of the destination address?
		 */
		s = gen_abs_offset_varpart(cstate, &cstate->off_linkhdr);

		/*
		 * If "s" is non-null, it has code to arrange that the
		 * X register contains the length of the prefix preceding
		 * the link-layer header.  Add to it the offset computed
		 * into the register specified by "index", and move that
		 * into the X register.  Otherwise, just load into the X
		 * register the offset computed into the register specified
		 * by "index".
		 */
		if (s != NULL) {
			sappend(s, xfer_to_a(cstate, inst));
			sappend(s, new_stmt(cstate, BPF_ALU|BPF_ADD|BPF_X));
			sappend(s, new_stmt(cstate, BPF_MISC|BPF_TAX));
		} else
			s = xfer_to_x(cstate, inst);

		/*
		 * Load the item at the sum of the offset we've put in the
		 * X register and the offset of the start of the link
		 * layer header (which is 0 if the radio header is
		 * variable-length; that header length is what we put
		 * into the X register and then added to the index).
		 */
		tmp = new_stmt(cstate, BPF_LD|BPF_IND|size);
		tmp->s.k = cstate->off_linkhdr.constant_part;
		sappend(s, tmp);
		sappend(inst->s, s);
		break;

	case Q_IP:
	case Q_ARP:
	case Q_RARP:
	case Q_ATALK:
	case Q_DECNET:
	case Q_SCA:
	case Q_LAT:
	case Q_MOPRC:
	case Q_MOPDL:
	case Q_IPV6:
		/*
		 * The offset is relative to the beginning of
		 * the network-layer header.
		 * XXX - are there any cases where we want
		 * cstate->off_nl_nosnap?
		 */
		s = gen_abs_offset_varpart(cstate, &cstate->off_linkpl);

		/*
		 * If "s" is non-null, it has code to arrange that the
		 * X register contains the variable part of the offset
		 * of the link-layer payload.  Add to it the offset
		 * computed into the register specified by "index",
		 * and move that into the X register.  Otherwise, just
		 * load into the X register the offset computed into
		 * the register specified by "index".
		 */
		if (s != NULL) {
			sappend(s, xfer_to_a(cstate, inst));
			sappend(s, new_stmt(cstate, BPF_ALU|BPF_ADD|BPF_X));
			sappend(s, new_stmt(cstate, BPF_MISC|BPF_TAX));
		} else
			s = xfer_to_x(cstate, inst);

		/*
		 * Load the item at the sum of the offset we've put in the
		 * X register, the offset of the start of the network
		 * layer header from the beginning of the link-layer
		 * payload, and the constant part of the offset of the
		 * start of the link-layer payload.
		 */
		tmp = new_stmt(cstate, BPF_LD|BPF_IND|size);
		tmp->s.k = cstate->off_linkpl.constant_part + cstate->off_nl;
		sappend(s, tmp);
		sappend(inst->s, s);

		/*
		 * Do the computation only if the packet contains
		 * the protocol in question.
		 */
		b = gen_proto_abbrev(cstate, proto);
		if (inst->b)
			gen_and(inst->b, b);
		inst->b = b;
		break;

	case Q_SCTP:
	case Q_TCP:
	case Q_UDP:
	case Q_ICMP:
	case Q_IGMP:
	case Q_IGRP:
	case Q_PIM:
	case Q_VRRP:
	case Q_CARP:
		/*
		 * The offset is relative to the beginning of
		 * the transport-layer header.
		 *
		 * Load the X register with the length of the IPv4 header
		 * (plus the offset of the link-layer header, if it's
		 * a variable-length header), in bytes.
		 *
		 * XXX - are there any cases where we want
		 * cstate->off_nl_nosnap?
		 * XXX - we should, if we're built with
		 * IPv6 support, generate code to load either
		 * IPv4, IPv6, or both, as appropriate.
		 */
		s = gen_loadx_iphdrlen(cstate);

		/*
		 * The X register now contains the sum of the variable
		 * part of the offset of the link-layer payload and the
		 * length of the network-layer header.
		 *
		 * Load into the A register the offset relative to
		 * the beginning of the transport layer header,
		 * add the X register to that, move that to the
		 * X register, and load with an offset from the
		 * X register equal to the sum of the constant part of
		 * the offset of the link-layer payload and the offset,
		 * relative to the beginning of the link-layer payload,
		 * of the network-layer header.
		 */
		sappend(s, xfer_to_a(cstate, inst));
		sappend(s, new_stmt(cstate, BPF_ALU|BPF_ADD|BPF_X));
		sappend(s, new_stmt(cstate, BPF_MISC|BPF_TAX));
		sappend(s, tmp = new_stmt(cstate, BPF_LD|BPF_IND|size));
		tmp->s.k = cstate->off_linkpl.constant_part + cstate->off_nl;
		sappend(inst->s, s);

		/*
		 * Do the computation only if the packet contains
		 * the protocol in question - which is true only
		 * if this is an IP datagram and is the first or
		 * only fragment of that datagram.
		 */
		gen_and(gen_proto_abbrev(cstate, proto), b = gen_ipfrag(cstate));
		if (inst->b)
			gen_and(inst->b, b);
		gen_and(gen_proto_abbrev(cstate, Q_IP), b);
		inst->b = b;
		break;
	case Q_ICMPV6:
		bpf_error(cstate, "IPv6 upper-layer protocol is not supported by proto[x]");
		/*NOTREACHED*/
	}
	inst->regno = regno;
	s = new_stmt(cstate, BPF_ST);
	s->s.k = regno;
	sappend(inst->s, s);

	return inst;
}